

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::initializeImage
          (ImageBindingRenderCase *this,GLint imageBindingPoint,GLint textureBindingPoint,
          GLint textureName,Vec4 *color)

{
  GLenum GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  void *pvVar5;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 uVar6;
  PixelBufferAccess local_140;
  PixelBufferAccess local_118;
  TextureFormat local_f0;
  undefined1 local_e8 [8];
  TextureLevel level_1;
  PixelBufferAccess local_88;
  TextureFormat local_60;
  undefined1 local_58 [8];
  TextureLevel level;
  Functions *gl;
  Vec4 *color_local;
  GLint textureName_local;
  GLint textureBindingPoint_local;
  GLint imageBindingPoint_local;
  ImageBindingRenderCase *this_local;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  pRVar4 = Context::getRenderContext((this->super_LayoutBindingRenderCase).super_TestCase.m_context)
  ;
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  level.m_data.m_cap = CONCAT44(extraout_var,iVar3);
  (**(code **)(level.m_data.m_cap + 8))(textureBindingPoint + 0x84c0);
  (**(code **)(level.m_data.m_cap + 0xb8))(this->m_textureType,textureName);
  (**(code **)(level.m_data.m_cap + 0x1360))(this->m_textureType,0x2801,0x2601);
  if (this->m_textureType == 0xde1) {
    tcu::TextureFormat::TextureFormat(&local_60,RGBA,UNORM_INT8);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_58,&local_60,1,1,1);
    tcu::TextureLevel::getAccess(&local_88,(TextureLevel *)local_58);
    tcu::clear(&local_88,color);
    (**(code **)(level.m_data.m_cap + 0x1380))(this->m_textureType,1,0x8058,1);
    pcVar2 = *(code **)(level.m_data.m_cap + 0x13b8);
    GVar1 = this->m_textureType;
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&level_1.m_data.m_cap,(TextureLevel *)local_58);
    pvVar5 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&level_1.m_data.m_cap);
    (*pcVar2)(GVar1,0,0,0,1,1,0x1908,0x1401,pvVar5);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_58);
  }
  else if (this->m_textureType == 0x806f) {
    tcu::TextureFormat::TextureFormat(&local_f0,RGBA,UNORM_INT8);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_e8,&local_f0,1,1,1);
    tcu::TextureLevel::getAccess(&local_118,(TextureLevel *)local_e8);
    tcu::clear(&local_118,color);
    (**(code **)(level.m_data.m_cap + 0x1398))(this->m_textureType,1,0x8058,1,1);
    pcVar2 = *(code **)(level.m_data.m_cap + 0x13c0);
    GVar1 = this->m_textureType;
    tcu::TextureLevel::getAccess(&local_140,(TextureLevel *)local_e8);
    pvVar5 = tcu::PixelBufferAccess::getDataPtr(&local_140);
    (*pcVar2)(GVar1,0,0,0,0,1,1,1,CONCAT44(uVar6,0x1908),0x1401,pvVar5);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_e8);
  }
  (**(code **)(level.m_data.m_cap + 0xb8))(this->m_textureType,0);
  (**(code **)(level.m_data.m_cap + 0x80))(imageBindingPoint,textureName,0,1,0,35000,0x8058);
  err = (**(code **)(level.m_data.m_cap + 0x800))();
  glu::checkError(err,"Image initialization failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x5c2);
  return;
}

Assistant:

void ImageBindingRenderCase::initializeImage (glw::GLint imageBindingPoint, glw::GLint textureBindingPoint, glw::GLint textureName, const Vec4& color) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE0 + textureBindingPoint);
	gl.bindTexture(m_textureType, textureName);
	gl.texParameteri(m_textureType, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

	switch (m_textureType)
	{
		case GL_TEXTURE_2D:
		{
			tcu::TextureLevel level(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			tcu::clear(level.getAccess(), color);
			gl.texStorage2D(m_textureType, 1, GL_RGBA8, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			gl.texSubImage2D(m_textureType, 0, 0, 0, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, GL_RGBA, GL_UNSIGNED_BYTE, level.getAccess().getDataPtr());
			break;
		}

		case GL_TEXTURE_3D:
		{
			tcu::TextureLevel level(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			tcu::clear(level.getAccess(), color);
			gl.texStorage3D(m_textureType, 1, GL_RGBA8, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE);
			gl.texSubImage3D(m_textureType, 0, 0, 0, 0, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, GL_RGBA, GL_UNSIGNED_BYTE, level.getAccess().getDataPtr());
			break;
		}

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(m_textureType, 0);
	gl.bindImageTexture(imageBindingPoint, textureName, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Image initialization failed");
}